

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_006212a0;
  memset(&this->_internal_metadata_,0,0xa8);
  if (scc_info_FileDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_FileDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base)
    ;
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->syntax_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (FileOptions *)0x0;
  this->source_code_info_ = (SourceCodeInfo *)0x0;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FileDescriptorProto)
}